

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O0

raw_result<baryonyx::itm::minimize_tag> * __thiscall
baryonyx::itm::storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::minimize_tag>::
get_worst(storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::minimize_tag> *this)

{
  int iVar1;
  const_reference pvVar2;
  const_reference this_00;
  const_reference local_38;
  bool local_21;
  int local_14;
  int end;
  int last;
  storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::minimize_tag> *this_local;
  
  local_14 = 1;
  iVar1 = length<std::vector<int,std::allocator<int>>>(&this->m_indices);
  while( true ) {
    local_21 = false;
    if (local_14 != iVar1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_indices,(long)local_14);
      this_00 = std::
                vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
                ::operator[](&this->m_data,(long)*pvVar2);
      local_21 = raw_result<baryonyx::itm::minimize_tag>::is_solution(this_00);
    }
    if (local_21 == false) break;
    local_14 = local_14 + 1;
  }
  if (local_14 == iVar1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->m_indices,(long)(local_14 + -1));
    local_38 = std::
               vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
               ::operator[](&this->m_data,(long)*pvVar2);
  }
  else {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_indices,(long)local_14);
    local_38 = std::
               vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
               ::operator[](&this->m_data,(long)*pvVar2);
  }
  return local_38;
}

Assistant:

const raw_result<Mode>& get_worst() const noexcept
    {
        int last = 1;
        const int end = length(m_indices);

        while (last != end && m_data[m_indices[last]].is_solution())
            ++last;

        return last == end ? m_data[m_indices[last - 1]]
                           : m_data[m_indices[last]];
    }